

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
AddKel(TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
       *this,TPZFMatrix<long_double> *elmat,TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  void *mineq_00;
  int64_t iVar2;
  TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
  *this_00;
  TPZBaseMatrix *in_RDI;
  lock_guard<std::mutex> lock;
  TPZEqnArray<long_double> *AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff98;
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
  *in_stack_ffffffffffffffa0;
  int64_t *in_stack_ffffffffffffffa8;
  TPZVec<long> *in_stack_ffffffffffffffb8;
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
  *in_stack_ffffffffffffffc0;
  TPZFMatrix<long_double> *in_stack_ffffffffffffffc8;
  TPZFrontNonSym<long_double> *in_stack_ffffffffffffffd0;
  long local_28;
  long local_20;
  
  TPZFrontNonSym<long_double>::AddKel
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (TPZVec<long> *)in_stack_ffffffffffffffc0);
  TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
  EquationsToDecompose
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int64_t *)in_RDI,
             in_stack_ffffffffffffffa8);
  if (local_20 <= local_28) {
    mineq_00 = operator_new(0x51e0);
    TPZEqnArray<long_double>::TPZEqnArray((TPZEqnArray<long_double> *)in_stack_ffffffffffffffc0);
    TPZFrontNonSym<long_double>::DecomposeEquations
              ((TPZFrontNonSym<long_double> *)in_RDI,(int64_t)mineq_00,
               (int64_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
    CheckCompress(in_stack_ffffffffffffffa0);
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    TPZStack<TPZEqnArray<long_double>_*,_10>::Push
              ((TPZStack<TPZEqnArray<long_double>_*,_10> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (local_28 == iVar2 + -1) {
      this_00 = (TPZParFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
                 *)std::operator<<((ostream *)&std::cout,"Decomposition finished");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      FinishWriting(this_00);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d415a8);
    std::condition_variable::notify_all();
  }
  DVar1 = TPZFront<long_double>::GetDecomposeType((TPZFront<long_double> *)&in_RDI[0x1998].fCol);
  in_RDI->fDecomposed = (char)DVar1;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex)
{
	
	// message #1.3 to fFront:TPZFront
	this->fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif

	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);
	if(maxeq >= mineq) {

		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;
		
		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        {
            std::lock_guard<std::mutex> lock(fwritelock);
            fEqnStack.Push(AuxEqn);
            if(maxeq == this->Rows()-1){
                cout << "Decomposition finished" << endl;
                cout.flush();
                FinishWriting();
                //fStorage.ReOpen();
            }
        }
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}